

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O3

void __thiscall
TPZInterpolationSpace::MinMaxSolutionValues
          (TPZInterpolationSpace *this,TPZVec<double> *min,TPZVec<double> *max)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  long *plVar6;
  TPZIntPoints *pTVar7;
  ulong uVar8;
  long size;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  TPZAutoPointer<TPZIntPoints> intrule;
  REAL weight;
  TPZManVector<int,_3> prevorder;
  TPZManVector<int,_3> maxorder;
  TPZManVector<double,_3> intpoint;
  TPZFNMatrix<9,_double> axes;
  TPZMaterialDataT<double> data;
  TPZAutoPointer<TPZIntPoints> local_8400;
  uint local_83f4;
  TPZVec<double> *local_83f0;
  TPZVec<double> *local_83e8;
  undefined1 local_83e0 [8];
  TPZManVector<int,_3> local_83d8;
  TPZManVector<int,_3> local_83a8;
  TPZManVector<double,_3> local_8378;
  TPZFMatrix<double> local_8340;
  double local_82b0 [10];
  TPZMaterialDataT<double> local_8260;
  
  local_83f0 = max;
  local_83e8 = min;
  iVar5 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xb0))();
  size = (long)iVar5;
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = (undefined **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_8378,size,(double *)&local_8260);
  plVar6 = (long *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x2c8))(this);
  pTVar7 = (TPZIntPoints *)(**(code **)(*plVar6 + 0x48))(plVar6);
  local_8400.fRef = (TPZReference *)operator_new(0x10);
  ((local_8400.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_8400.fRef)->fPointer = pTVar7;
  LOCK();
  ((local_8400.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ =
       local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ & 0xffffffff00000000;
  TPZManVector<int,_3>::TPZManVector(&local_83d8,size,(int *)&local_8260);
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[6])((local_8400.fRef)->fPointer,&local_83d8);
  iVar5 = (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[7])();
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_4_ = iVar5;
  TPZManVector<int,_3>::TPZManVector(&local_83a8,size,(int *)&local_8260);
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[5])((local_8400.fRef)->fPointer,&local_83a8,0);
  local_8340.fElem = local_82b0;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_8340.fSize = 9;
  local_8340.fGiven = local_8340.fElem;
  TPZVec<int>::TPZVec(&local_8340.fPivot.super_TPZVec<int>,0);
  local_8340.fPivot.super_TPZVec<int>.fStore = local_8340.fPivot.fExtAlloc;
  local_8340.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_8340.fPivot.super_TPZVec<int>.fNElements = 0;
  local_8340.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_8340.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_8340.fWork.fStore = (double *)0x0;
  local_8340.fWork.fNElements = 0;
  local_8340.fWork.fNAlloc = 0;
  local_8340.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_8340,0.0);
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
  local_83f4 = (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[3])();
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[4])
            ((local_8400.fRef)->fPointer,0,&local_8378,local_83e0);
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x298))(this,&local_8260);
  local_8260.super_TPZMaterialData.fNeedsSol = true;
  (**(code **)(*(long *)&this->super_TPZCompEl + 0x2a8))(this,&local_8260,&local_8378);
  TPZVec<double>::operator=
            (local_83e8,
             &(local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>)
  ;
  TPZVec<double>::operator=
            (local_83f0,
             &(local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>)
  ;
  if (1 < (int)local_83f4) {
    uVar10 = 1;
    do {
      (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[4])
                ((local_8400.fRef)->fPointer,uVar10,&local_8378,local_83e0);
      (**(code **)(*(long *)&this->super_TPZCompEl + 0x298))(this,&local_8260);
      local_8260.super_TPZMaterialData.fNeedsSol = true;
      (**(code **)(*(long *)&this->super_TPZCompEl + 0x2a8))(this,&local_8260,&local_8378);
      if (0 < (int)(uint)local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements) {
        pdVar2 = ((local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->
                 super_TPZVec<double>).fStore;
        pdVar3 = local_83e8->fStore;
        pdVar4 = local_83f0->fStore;
        uVar8 = 0;
        do {
          dVar11 = pdVar2[uVar8];
          if (dVar11 < pdVar3[uVar8]) {
            pdVar3[uVar8] = dVar11;
            dVar11 = pdVar2[uVar8];
          }
          pdVar1 = pdVar4 + uVar8;
          if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
            pdVar4[uVar8] = dVar11;
          }
          uVar8 = uVar8 + 1;
        } while (((uint)local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fNElements &
                 0x7fffffff) != uVar8);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != local_83f4);
  }
  (*(local_8400.fRef)->fPointer->_vptr_TPZIntPoints[5])((local_8400.fRef)->fPointer,&local_83d8,0);
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018c0eb8;
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7950));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7070));
  TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
            ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0));
  TPZMaterialData::~TPZMaterialData(&local_8260.super_TPZMaterialData,&PTR_PTR_018c0f20);
  TPZFMatrix<double>::~TPZFMatrix(&local_8340,&PTR_PTR_01816200);
  if (local_83a8.super_TPZVec<int>.fStore != local_83a8.fExtAlloc) {
    local_83a8.super_TPZVec<int>.fNAlloc = 0;
    local_83a8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_83a8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_83a8.super_TPZVec<int>.fStore);
    }
  }
  if (local_83d8.super_TPZVec<int>.fStore != local_83d8.fExtAlloc) {
    local_83d8.super_TPZVec<int>.fNAlloc = 0;
    local_83d8.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_83d8.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_83d8.super_TPZVec<int>.fStore);
    }
  }
  TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&local_8400);
  TPZManVector<double,_3>::~TPZManVector(&local_8378);
  return;
}

Assistant:

void TPZInterpolationSpace::MinMaxSolutionValues(TPZVec<STATE> &min, TPZVec<STATE> &max){
	
	const int dim = Dimension();
	TPZManVector<REAL,3> intpoint(dim,0.);
	
	TPZAutoPointer<TPZIntPoints> intrule = GetIntegrationRule().Clone();
	TPZManVector<int,3> prevorder(dim,0);
	intrule->GetOrder(prevorder);
	
	TPZManVector<int,3> maxorder(dim,intrule->GetMaxOrder());
	intrule->SetOrder(maxorder);
	
	
	TPZFNMatrix<9> axes(3,3,0.);
	REAL weight;
	TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
	const int intrulepoints = intrule->NPoints();
	intrule->Point(0,intpoint,weight);
    
	this->ComputeSolution(intpoint, data,hasPhi);
	min = data.sol[0];
	max = data.sol[0];
	const int nvars = data.sol.NElements();
	for(int int_ind = 1; int_ind < intrulepoints; int_ind++){
		intrule->Point(int_ind,intpoint,weight);
		this->ComputeSolution(intpoint, data,hasPhi);
        TPZSolVec<STATE> &sol = data.sol;
		for(int iv = 0; iv < nvars; iv++){
			if (sol[0][iv] < min[iv]) min[iv] = sol[0][iv];
			if (sol[0][iv] > max[iv]) max[iv] = sol[0][iv];
		}//iv
	}//loop over integratin points
	
	intrule->SetOrder(prevorder);
	
}